

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

PropertyId Js::JavascriptOperators::GetPropertyId(Var propertyName,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptSymbol *pJVar2;
  JavascriptSymbolObject *pJVar3;
  JavascriptString *propertyString;
  Type *propertyRecord;
  Type local_28;
  
  local_28.ptr = (PropertyRecord *)0x0;
  bVar1 = VarIs<Js::JavascriptSymbol>(propertyName);
  if ((!bVar1) ||
     (pJVar2 = UnsafeVarTo<Js::JavascriptSymbol>(propertyName), pJVar2 == (JavascriptSymbol *)0x0))
  {
    bVar1 = VarIs<Js::JavascriptSymbolObject>(propertyName);
    if ((!bVar1) ||
       (pJVar3 = UnsafeVarTo<Js::JavascriptSymbolObject>(propertyName),
       pJVar3 == (JavascriptSymbolObject *)0x0)) {
      propertyString = JavascriptConversion::ToString(propertyName,scriptContext);
      propertyRecord = (Type *)&local_28;
      ScriptContext::GetOrAddPropertyRecord
                (scriptContext,propertyString,(PropertyRecord **)propertyRecord);
      goto LAB_00aa7f6f;
    }
    pJVar2 = (pJVar3->value).ptr;
  }
  propertyRecord = &pJVar2->propertyRecordUsageCache;
LAB_00aa7f6f:
  return ((propertyRecord->propertyRecord).ptr)->pid;
}

Assistant:

Js::PropertyId JavascriptOperators::GetPropertyId(Var propertyName, ScriptContext* scriptContext)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<Js::JavascriptSymbol>(propertyName);
        if (symbol)
        {
            propertyRecord = symbol->GetValue();
        }
        else
        {
            JavascriptSymbolObject * symbolObject = JavascriptOperators::TryFromVar<JavascriptSymbolObject>(propertyName);
            if (symbolObject)
            {
                propertyRecord = symbolObject->GetValue();
            }
            else
            {
                JavascriptString * indexStr = JavascriptConversion::ToString(propertyName, scriptContext);
                scriptContext->GetOrAddPropertyRecord(indexStr, &propertyRecord);
            }
        }

        return propertyRecord->GetPropertyId();
    }